

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::QueryPool>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  int *piVar1;
  long *plVar2;
  undefined8 uVar3;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar4;
  size_t sVar5;
  char *__s;
  size_t sVar6;
  deUint64 *pdVar7;
  long *plVar8;
  size_type __n;
  long lVar9;
  ulong uVar10;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  undefined1 local_238 [16];
  pointer local_228;
  VkAllocationCallbacks *pVStack_220;
  Handle<(vk::HandleType)11> local_218;
  Deleter<vk::Handle<(vk::HandleType)11>_> DStack_210;
  VkDevice local_1f0;
  DeviceInterface *local_1e8;
  ulong local_1e0;
  Move<vk::Handle<(vk::HandleType)11>_> local_1d8;
  undefined1 local_1b0 [8];
  VkAllocationCallbacks local_1a8 [2];
  ios_base local_138 [264];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0,allocator,0x400);
  vk = Context::getDeviceInterface((Context *)this);
  device = Context::getDevice((Context *)this);
  Context::getUniversalQueueFamilyIndex((Context *)this);
  sVar4 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  local_1e0 = (ulong)context >> 0x20;
  local_218.m_internal._0_4_ = 0xb;
  DStack_210.m_deviceIface = (DeviceInterface *)0x0;
  DStack_210.m_device = (VkDevice)((long)context << 0x20);
  DStack_210.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(params.queryType,(int)((ulong)context >> 0x20));
  ::vk::createQueryPool(&local_1d8,vk,device,(VkQueryPoolCreateInfo *)&local_218,local_1a8);
  local_238._0_8_ =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal;
  local_238._8_8_ =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface;
  local_228 = (pointer)local_1d8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                       m_device;
  pVStack_220 = local_1d8.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator;
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  if (local_238._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)11>_> *)(local_238 + 8),
               (VkQueryPool)local_238._0_8_);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0);
  sVar4 = getSafeObjectCount((Context *)this,sVar5 - sVar4,0);
  __n = 0x4000;
  if (sVar4 < 0x4000) {
    __n = sVar4;
  }
  local_1e8 = Context::getDeviceInterface((Context *)this);
  local_1f0 = Context::getDevice((Context *)this);
  Context::getUniversalQueueFamilyIndex((Context *)this);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
            *)local_238,__n,(allocator_type *)local_1b0);
  local_1b0 = *(undefined1 (*) [8])(*(long *)this + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)11>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)((long)local_1a8[0].pUserData + -0x18));
  }
  else {
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar4 != 0) {
    lVar9 = 8;
    uVar10 = 0;
    do {
      pdVar7 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = 0xb;
      local_1a8[0].pUserData = (void *)0x0;
      local_1a8[0].pfnAllocation._0_4_ = 0;
      local_1a8[0].pfnReallocation._0_4_ = (deUint32)local_1e0;
      local_1a8[0].pfnAllocation._4_4_ = (VkQueryType)context;
      local_1a8[0].pfnReallocation._4_4_ = params.queryType;
      ::vk::createQueryPool
                ((Move<vk::Handle<(vk::HandleType)11>_> *)&local_218,local_1e8,local_1f0,
                 (VkQueryPoolCreateInfo *)local_1b0,(VkAllocationCallbacks *)0x0);
      pdVar7[2] = (deUint64)DStack_210.m_device;
      pdVar7[3] = (deUint64)DStack_210.m_allocator;
      *pdVar7 = local_218.m_internal;
      pdVar7[1] = (deUint64)DStack_210.m_deviceIface;
      local_218.m_internal = 0;
      DStack_210.m_deviceIface = (DeviceInterface *)0x0;
      DStack_210.m_device = (VkDevice)0x0;
      DStack_210.m_allocator = (VkAllocationCallbacks *)0x0;
      plVar8 = (long *)operator_new(0x20);
      uVar3 = local_238._0_8_;
      *(undefined4 *)(plVar8 + 1) = 0;
      *(undefined4 *)((long)plVar8 + 0xc) = 0;
      *plVar8 = (long)&PTR__SharedPtrState_00d1df90;
      plVar8[2] = (long)pdVar7;
      *(undefined4 *)(plVar8 + 1) = 1;
      *(undefined4 *)((long)plVar8 + 0xc) = 1;
      plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)local_238._0_8_ + lVar9)
      ;
      if (plVar2 != plVar8) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)(local_238._0_8_ + lVar9 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)
                                           local_238._0_8_ + lVar9) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)uVar3 + lVar9
                                    ) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)uVar3 + lVar9);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)uVar3 + lVar9) = 0;
          }
        }
        *(deUint64 **)(uVar3 + lVar9 + -8) = pdVar7;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)uVar3 + lVar9) = plVar8;
        LOCK();
        *(int *)(plVar8 + 1) = (int)plVar8[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)11>_> **)uVar3 + lVar9)
                        + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar2 = plVar8 + 1;
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar8 + 0x10))(plVar8);
      }
      LOCK();
      piVar1 = (int *)((long)plVar8 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar8 + 8))(plVar8);
      }
      if (local_218.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()
                  (&DStack_210,(VkQueryPool)local_218.m_internal);
      }
      if ((uVar10 & 0x3ff) == 0 && uVar10 != 0) {
        tcu::TestContext::touchWatchdog(*(TestContext **)this);
      }
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x10;
    } while (__n != uVar10);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
                     *)local_238,(pointer)local_238._0_8_);
  local_1b0 = (undefined1  [8])&local_1a8[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0,
             (undefined1 *)((long)local_1a8[0].pUserData + (long)local_1b0));
  if (local_1b0 != (undefined1  [8])&local_1a8[0].pfnAllocation) {
    operator_delete((void *)local_1b0,
                    CONCAT44(local_1a8[0].pfnAllocation._4_4_,
                             (VkQueryPoolCreateFlags)local_1a8[0].pfnAllocation) + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>_>_>_>
             *)local_238);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}